

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoinNode.cpp
# Opt level: O1

void __thiscall JoinNode::JoinNode(JoinNode *this,Instruction *value,CallInst *callInst)

{
  _Rb_tree_header *p_Var1;
  
  Node::Node(&this->super_Node,JOIN,value,callInst);
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__JoinNode_00127b08;
  p_Var1 = &(this->joinPredecessors_)._M_t._M_impl.super__Rb_tree_header;
  (this->joinPredecessors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->joinPredecessors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->joinPredecessors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->joinPredecessors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->joinPredecessors_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->correspondingForks_)._M_t._M_impl.super__Rb_tree_header;
  (this->correspondingForks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->correspondingForks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->correspondingForks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->correspondingForks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->correspondingForks_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

JoinNode::JoinNode(const llvm::Instruction *value,
                   const llvm::CallInst *callInst)
        : Node(NodeType::JOIN, value, callInst) {}